

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QPalette __thiscall
QWidgetPrivate::naturalWidgetPalette(QWidgetPrivate *this,ResolveMask inheritedMask)

{
  byte bVar1;
  bool bVar2;
  QWidget *pQVar3;
  QPalette *pQVar4;
  pointer pQVar5;
  undefined8 extraout_RDX;
  QWidgetPrivate *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QPalette QVar6;
  QWidget *p;
  bool useStyleSheetPropagationInWidgetStyles;
  QWidget *q;
  QPalette *naturalPalette;
  QPalette inheritedPalette_1;
  QPalette inheritedPalette;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  QWidget *this_00;
  QWidget *in_stack_ffffffffffffff78;
  QPalette local_58;
  undefined1 local_48 [16];
  QPalette local_38;
  undefined1 local_28 [16];
  QPalette local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  q_func(in_RSI);
  bVar1 = QCoreApplication::testAttribute(AA_UseStyleSheetPropagationInWidgetStyles);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  QApplication::palette(in_stack_ffffffffffffff78);
  bVar2 = QWidget::testAttribute((QWidget *)in_RSI,(WidgetAttribute)((ulong)this_00 >> 0x20));
  if (((!bVar2) || ((bVar1 & 1) != 0)) &&
     (((bVar2 = QWidget::isWindow(this_00), !bVar2 ||
       (bVar2 = QWidget::testAttribute((QWidget *)in_RSI,(WidgetAttribute)((ulong)this_00 >> 0x20)),
       bVar2)) ||
      ((bVar2 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36ca16), bVar2 &&
       (pQVar5 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36ca2d),
       pQVar5->proxyWidget != (QGraphicsProxyWidget *)0x0)))))) {
    pQVar3 = QWidget::parentWidget((QWidget *)0x36ca42);
    if (pQVar3 == (QWidget *)0x0) {
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36cb67);
      if ((bVar2) &&
         (pQVar5 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                             ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36cb7e),
         pQVar5->proxyWidget != (QGraphicsProxyWidget *)0x0)) {
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                  ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36cbab);
        QGraphicsWidget::palette((QGraphicsWidget *)in_RSI);
        QPalette::setResolveMask((ulonglong)local_48);
        QPalette::resolve((QPalette *)&local_58);
        QPalette::operator=((QPalette *)this_00,
                            (QPalette *)
                            CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
        QPalette::~QPalette(&local_58);
        QPalette::~QPalette((QPalette *)local_48);
      }
    }
    else {
      bVar2 = QWidget::testAttribute((QWidget *)in_RSI,(WidgetAttribute)((ulong)this_00 >> 0x20));
      if ((!bVar2) || ((bVar1 & 1) != 0)) {
        QGuiApplication::palette();
        bVar1 = QPalette::isCopyOf((QPalette *)in_RDI);
        bVar1 = bVar1 ^ 0xff;
        QPalette::~QPalette(&local_18);
        if ((bVar1 & 1) == 0) {
          pQVar4 = QWidget::palette(this_00);
          QPalette::operator=((QPalette *)in_RDI,(QPalette *)pQVar4);
        }
        else {
          local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar4 = QWidget::palette(this_00);
          QPalette::QPalette((QPalette *)local_28,(QPalette *)pQVar4);
          QPalette::setResolveMask((ulonglong)local_28);
          QPalette::resolve((QPalette *)&local_38);
          QPalette::operator=((QPalette *)this_00,
                              (QPalette *)CONCAT17(bVar1,in_stack_ffffffffffffff58));
          QPalette::~QPalette(&local_38);
          QPalette::~QPalette((QPalette *)local_28);
        }
      }
    }
  }
  QPalette::setResolveMask((ulonglong)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar6._8_8_ = extraout_RDX;
    QVar6.d = (QPalettePrivate *)this_00;
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QPalette QWidgetPrivate::naturalWidgetPalette(QPalette::ResolveMask inheritedMask) const
{
    Q_Q(const QWidget);

    const bool useStyleSheetPropagationInWidgetStyles =
        QCoreApplication::testAttribute(Qt::AA_UseStyleSheetPropagationInWidgetStyles);

    QPalette naturalPalette = QApplication::palette(q);
    if ((!q->testAttribute(Qt::WA_StyleSheet) || useStyleSheetPropagationInWidgetStyles)
        && (!q->isWindow() || q->testAttribute(Qt::WA_WindowPropagation)
#if QT_CONFIG(graphicsview)
            || (extra && extra->proxyWidget)
#endif // QT_CONFIG(graphicsview)
            )) {
        if (QWidget *p = q->parentWidget()) {
            if (!p->testAttribute(Qt::WA_StyleSheet) || useStyleSheetPropagationInWidgetStyles) {
                if (!naturalPalette.isCopyOf(QGuiApplication::palette())) {
                    QPalette inheritedPalette = p->palette();
                    inheritedPalette.setResolveMask(inheritedMask);
                    naturalPalette = inheritedPalette.resolve(naturalPalette);
                } else {
                    naturalPalette = p->palette();
                }
            }
        }
#if QT_CONFIG(graphicsview)
        else if (extra && extra->proxyWidget) {
            QPalette inheritedPalette = extra->proxyWidget->palette();
            inheritedPalette.setResolveMask(inheritedMask);
            naturalPalette = inheritedPalette.resolve(naturalPalette);
        }
#endif // QT_CONFIG(graphicsview)
    }
    naturalPalette.setResolveMask(0);
    return naturalPalette;
}